

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip324.cpp
# Opt level: O1

uint32_t __thiscall BIP324Cipher::DecryptLength(BIP324Cipher *this,Span<const_std::byte> input)

{
  long in_FS_OFFSET;
  Span<std::byte> output;
  byte buf [3];
  uint3 local_13;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (input.m_size != 3) {
    __assert_fail("input.size() == LENGTH_LEN",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/bip324.cpp"
                  ,0x5b,"uint32_t BIP324Cipher::DecryptLength(Span<const std::byte>)");
  }
  output.m_size = 3;
  output.m_data = (byte *)&local_13;
  FSChaCha20::Crypt((FSChaCha20 *)&this->m_recv_l_cipher,input,output);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (uint)local_13;
  }
  __stack_chk_fail();
}

Assistant:

uint32_t BIP324Cipher::DecryptLength(Span<const std::byte> input) noexcept
{
    assert(input.size() == LENGTH_LEN);

    std::byte buf[LENGTH_LEN];
    // Decrypt length
    m_recv_l_cipher->Crypt(input, buf);
    // Convert to number.
    return uint32_t(buf[0]) + (uint32_t(buf[1]) << 8) + (uint32_t(buf[2]) << 16);
}